

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O3

int PAL_wvsscanf(LPCWSTR Buffer,LPCWSTR Format,__va_list_tag *ap)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  char16_t cVar4;
  FILE *pFVar5;
  byte bVar6;
  char16_t cVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  errno_t eVar11;
  DWORD DVar12;
  size_t sVar13;
  char *__nptr;
  undefined7 uVar17;
  undefined8 *puVar14;
  LPSTR lpMultiByteStr;
  size_t sVar15;
  long *plVar16;
  char cVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  char16_t cVar22;
  char *pcVar23;
  LPCWSTR pWVar24;
  char16_t *pcVar25;
  char *_Dst;
  ulong uVar26;
  LPCWSTR pWVar27;
  long in_FS_OFFSET;
  int local_478;
  uint local_458;
  int local_454;
  int n;
  undefined4 local_44c;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 local_440;
  int local_43c;
  undefined2 local_438;
  char local_436 [6];
  CHAR TempBuff [1024];
  
  TempBuff._1016_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  cVar7 = *Format;
  if (cVar7 == L'\0') {
    iVar9 = 0;
LAB_00119b03:
    if (*(long *)(in_FS_OFFSET + 0x28) != TempBuff._1016_8_) {
      __stack_chk_fail();
    }
    return iVar9;
  }
  iVar9 = 0;
  iVar19 = -1;
  pWVar27 = Buffer;
LAB_00118f50:
  if ((*pWVar27 == L'\0') && (iVar9 == 0)) goto LAB_00119afd;
  iVar8 = isspace((uint)(ushort)cVar7);
  if (iVar8 == 0) {
    if (*Format == L'%') {
      pcVar25 = Format + 1;
      local_438 = CONCAT11(local_438._1_1_,0x25);
      sVar13 = PAL_wcslen(pcVar25);
      __nptr = (char *)PAL_malloc(sVar13 + 1);
      if (__nptr == (char *)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00119b3d;
        iVar19 = -1;
        DVar12 = 8;
        Format = pcVar25;
LAB_00119231:
        SetLastError(DVar12);
        goto LAB_001193e2;
      }
      cVar7 = *pcVar25;
      _Dst = (char *)((long)&local_438 + 1);
      cVar22 = cVar7;
      if (cVar7 == L'*') {
        local_438 = CONCAT11(0x2a,(char)local_438);
        cVar22 = Format[2];
        _Dst = local_436;
        pcVar25 = Format + 2;
      }
      Format = pcVar25;
      local_454 = iVar9;
      iVar9 = isdigit((uint)(ushort)cVar22);
      if (iVar9 == 0) {
        uVar26 = 0xffffffff;
      }
      else {
        iVar9 = isdigit((uint)(ushort)*Format);
        pcVar23 = __nptr;
        while (iVar9 != 0) {
          *pcVar23 = (char)*Format;
          pcVar23 = pcVar23 + 1;
          *_Dst = (char)*Format;
          _Dst = _Dst + 1;
          iVar9 = isdigit((uint)(ushort)Format[1]);
          Format = Format + 1;
        }
        *pcVar23 = '\0';
        uVar10 = atoi(__nptr);
        uVar26 = (ulong)uVar10;
        if ((int)uVar10 < 0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00119b3d;
          iVar19 = -1;
          DVar12 = 0x54f;
          iVar9 = local_454;
          goto LAB_00119231;
        }
      }
      iVar8 = (int)uVar26;
      iVar9 = -1;
      cVar22 = *Format;
      uVar10 = (uint)(ushort)cVar22;
      pcVar25 = Format;
      if (0x6b < (ushort)cVar22) {
        if (cVar22 == L'l') {
LAB_001190df:
          pcVar25 = Format + 1;
          cVar22 = Format[1];
          uVar10 = (uint)(ushort)cVar22;
          iVar19 = 2;
          if ((cVar22 != L'C') && (cVar22 != L'S')) {
            if (cVar22 != L'l') goto LAB_00119167;
            pcVar25 = Format + 2;
            iVar19 = 3;
          }
LAB_00119160:
          uVar10 = (uint)(ushort)*pcVar25;
          iVar9 = iVar19;
          goto LAB_00119167;
        }
        if (cVar22 != L'p') {
          if (cVar22 != L'w') goto LAB_00119167;
          goto LAB_001190df;
        }
LAB_001191f0:
        eVar11 = strcpy_s(_Dst,0x400,"ll");
        if (eVar11 != 0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00119b3d;
          iVar19 = 3;
          DVar12 = 0x7a;
          iVar9 = local_454;
          goto LAB_00119231;
        }
        sVar15 = strlen("ll");
        _Dst = _Dst + sVar15;
        n = 3;
LAB_0011936f:
        *_Dst = (char)*Format;
        local_43c = 3;
LAB_00119387:
        local_444 = 0;
LAB_0011939e:
        Format = Format + 1;
        _Dst = _Dst + 1;
        local_448 = 0;
        goto LAB_001193a8;
      }
      if (cVar22 == L'I') {
        if (Format[1] == L'6') {
          pcVar25 = Format + 3;
          if (Format[2] != L'4') {
            pcVar25 = Format;
          }
          iVar19 = (uint)(Format[2] == L'4') * 4 + -1;
          goto LAB_00119160;
        }
        bVar3 = true;
        n = -1;
        local_444 = 0;
        local_44c = 0;
        local_448 = 0;
        bVar6 = 0;
        local_440 = 0;
        local_43c = -1;
      }
      else {
        if (cVar22 == L'L') {
          pcVar25 = Format + 1;
          iVar19 = -1;
          goto LAB_00119160;
        }
        if (cVar22 == L'h') {
          pcVar25 = Format + 1;
          iVar19 = 1;
          goto LAB_00119160;
        }
LAB_00119167:
        Format = pcVar25;
        bVar3 = true;
        local_43c = -1;
        uVar17 = (undefined7)(uVar26 >> 8);
        n = iVar9;
        if (uVar10 < 0x47) {
          if (uVar10 == 0x20) {
            local_43c = 7;
          }
          else {
            if (uVar10 == 0x43) goto switchD_0011919c_caseD_63;
            if (uVar10 == 0x45) goto switchD_0011919c_caseD_65;
          }
          goto switchD_0011919c_caseD_59;
        }
        switch(uVar10) {
        case 0x58:
        case 100:
        case 0x69:
        case 0x6f:
        case 0x70:
        case 0x75:
        case 0x78:
          if (iVar9 == 3) goto LAB_001191f0;
          if (iVar9 == 2) {
            *_Dst = 'l';
            _Dst = _Dst + 1;
            n = 2;
          }
          else if (iVar9 == 1) {
            *_Dst = 'h';
            _Dst = _Dst + 1;
            n = 1;
          }
          goto LAB_0011936f;
        case 0x5b:
          *_Dst = '[';
          cVar22 = Format[1];
          if (cVar22 == L'^') {
            _Dst[1] = '^';
            _Dst = _Dst + 2;
            cVar22 = Format[2];
            Format = Format + 2;
          }
          else {
            _Dst = _Dst + 1;
            Format = Format + 1;
          }
          if (cVar22 == L']') {
            *_Dst = ']';
            _Dst = _Dst + 1;
            cVar22 = Format[1];
            Format = Format + 1;
          }
          if (cVar22 == L'-') {
            *_Dst = '-';
            _Dst = _Dst + 1;
            Format = Format + 1;
          }
          do {
            cVar22 = *Format;
            if (cVar22 == L'-') {
              cVar22 = Format[1];
              if (cVar22 == L']') {
                *_Dst = '-';
                goto LAB_0011991f;
              }
              cVar4 = Format[-1];
              if ((ushort)(cVar22 & 0xffU) < (ushort)(byte)cVar4) {
                _Dst[-1] = (char)cVar22;
                cVar22 = (char16_t)(byte)cVar4;
              }
              *_Dst = '-';
              _Dst[1] = (char)cVar22;
              _Dst = _Dst + 2;
              lVar20 = 4;
            }
            else {
              if (cVar22 == L'\0') goto LAB_0011996c;
              if (cVar22 == L']') goto code_r0x00119961;
              *_Dst = (char)cVar22;
LAB_0011991f:
              _Dst = _Dst + 1;
              lVar20 = 2;
            }
            Format = (LPCWSTR)((long)Format + lVar20);
          } while( true );
        case 99:
switchD_0011919c_caseD_63:
          local_43c = 1;
          if (iVar9 == 1) {
            n = 1;
          }
          else if ((iVar9 == 2) || ((short)uVar10 == 99)) {
            *_Dst = 'l';
            _Dst = _Dst + 1;
            n = 2;
          }
          *_Dst = 'c';
          _Dst = _Dst + 1;
          Format = Format + 1;
          local_44c = (undefined4)CONCAT71(uVar17,1);
          local_444 = 0;
          local_448 = 0;
          bVar6 = 1;
          goto LAB_001193ab;
        case 0x65:
        case 0x66:
        case 0x67:
switchD_0011919c_caseD_65:
          iVar9 = tolower(uVar10);
          *_Dst = (char)iVar9;
          local_43c = 5;
          goto LAB_00119387;
        case 0x6e:
          cVar18 = 'n';
          if (iVar9 == 1) {
            *_Dst = 'h';
            _Dst = _Dst + 1;
            cVar18 = (char)*Format;
          }
          *_Dst = cVar18;
          local_43c = 4;
          local_444 = (undefined4)CONCAT71(uVar17,1);
          goto LAB_0011939e;
        case 0x73:
switchD_0011919c_caseD_73:
          n = 1;
          if ((iVar9 != 1) && ((iVar9 == 2 || (n = iVar9, (short)uVar10 == 0x73)))) {
            *_Dst = 'l';
            _Dst = _Dst + 1;
            n = 2;
          }
          *_Dst = 's';
          _Dst = _Dst + 1;
          Format = Format + 1;
          local_43c = 2;
          local_44c = (undefined4)CONCAT71(uVar17,1);
          local_444 = 0;
          local_448 = 0;
          bVar6 = 0;
          local_440 = (undefined4)CONCAT71(uVar17,1);
          goto LAB_001193b5;
        default:
          if (uVar10 == 0x47) goto switchD_0011919c_caseD_65;
          if (uVar10 == 0x53) goto switchD_0011919c_caseD_73;
        case 0x59:
        case 0x5a:
        case 0x5c:
        case 0x5d:
        case 0x5e:
        case 0x5f:
        case 0x60:
        case 0x61:
        case 0x62:
        case 0x68:
        case 0x6a:
        case 0x6b:
        case 0x6c:
        case 0x6d:
        case 0x71:
        case 0x72:
        case 0x74:
        case 0x76:
        case 0x77:
switchD_0011919c_caseD_59:
          local_444 = 0;
          local_44c = 0;
          local_448 = 0;
          bVar6 = 0;
          local_440 = 0;
        }
      }
      goto LAB_001193b8;
    }
    goto LAB_001193e2;
  }
  pWVar24 = pWVar27 + -1;
  do {
    pWVar27 = pWVar24 + 1;
    pWVar24 = pWVar24 + 1;
    iVar8 = isspace((uint)(ushort)*pWVar27);
  } while (iVar8 != 0);
  Format = Format + 1;
  goto LAB_00119404;
code_r0x00119961:
  *_Dst = ']';
  _Dst = _Dst + 1;
  Format = Format + 1;
LAB_0011996c:
  local_43c = 6;
  local_448 = (undefined4)CONCAT71(uVar17,1);
  local_444 = 0;
LAB_001193a8:
  local_44c = 0;
  bVar6 = 0;
LAB_001193ab:
  local_440 = 0;
LAB_001193b5:
  bVar3 = false;
LAB_001193b8:
  _Dst[0] = '%';
  _Dst[1] = 'n';
  _Dst[2] = '\0';
  PAL_free(__nptr);
  iVar9 = local_454;
  iVar19 = local_43c;
  if (bVar3) {
LAB_001193e2:
    if ((*Format != *pWVar27) || (iVar19 == 7)) goto LAB_00119b03;
    Format = Format + 1;
    pWVar24 = pWVar27 + 1;
    goto LAB_00119404;
  }
  if (n != 2) {
    if ((char)local_444 != '\0') {
      if (n != 1) goto LAB_00119522;
      uVar10 = ap->gp_offset;
      if ((ulong)uVar10 < 0x29) {
        puVar14 = (undefined8 *)((ulong)uVar10 + (long)ap->reg_save_area);
        ap->gp_offset = uVar10 + 8;
      }
      else {
        puVar14 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar14 + 1;
      }
      local_478 = (int)Buffer;
      *(short *)*puVar14 = (short)((uint)((int)pWVar27 - local_478) >> 1);
      goto LAB_001197db;
    }
LAB_00119546:
    iVar9 = WideCharToMultiByte(0,0,pWVar27,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
    if (iVar9 == 0) {
      fprintf(_stderr,"] %s %s:%d","PAL_wvsscanf",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printf.cpp"
              ,0x554);
      pFVar5 = _stderr;
      DVar12 = GetLastError();
      fprintf(pFVar5,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar12);
LAB_00119afd:
      iVar9 = -1;
      goto LAB_00119b03;
    }
    lpMultiByteStr = (LPSTR)PAL_malloc((long)iVar9);
    if (lpMultiByteStr == (LPSTR)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) {
LAB_00119b3d:
        abort();
      }
      SetLastError(8);
      goto LAB_00119afd;
    }
    iVar9 = WideCharToMultiByte(0,0,pWVar27,iVar9,lpMultiByteStr,iVar9,(LPCSTR)0x0,(LPBOOL)0x0);
    iVar19 = local_43c;
    if (iVar9 == 0) {
      fprintf(_stderr,"] %s %s:%d","PAL_wvsscanf",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printf.cpp"
              ,0x563);
      pFVar5 = _stderr;
      DVar12 = GetLastError();
      fprintf(pFVar5,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar12);
      PAL_free(lpMultiByteStr);
      goto LAB_00119afd;
    }
    if (cVar7 == L'*') {
      iVar8 = sscanf_s(lpMultiByteStr,(char *)&local_438,&local_458);
      iVar19 = local_43c;
LAB_00119a16:
      PAL_free(lpMultiByteStr);
      iVar9 = local_454;
      if (iVar8 < 1) goto LAB_00119b03;
    }
    else {
      if ((char)local_448 == '\0') {
        uVar10 = ap->gp_offset;
        if ((ulong)uVar10 < 0x29) {
          puVar14 = (undefined8 *)((ulong)uVar10 + (long)ap->reg_save_area);
          ap->gp_offset = uVar10 + 8;
        }
        else {
          puVar14 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar14 + 1;
        }
        uVar2 = *puVar14;
        if (local_43c == 1) {
          if (iVar8 < 2) {
            uVar26 = 1;
          }
LAB_001199f8:
          iVar8 = sscanf_s(lpMultiByteStr,(char *)&local_438,uVar2,uVar26);
        }
        else {
          if (local_43c == 2) {
            if (iVar8 < 1) {
              sVar13 = PAL_wcslen(Buffer);
              iVar8 = (int)sVar13;
            }
            uVar26 = (ulong)(iVar8 + 1U);
            if (iVar8 + 1U != 0) goto LAB_001199f8;
          }
          iVar8 = sscanf_s(lpMultiByteStr,(char *)&local_438,uVar2,&local_458);
        }
        goto LAB_00119a16;
      }
      sVar15 = strlen((char *)&local_438);
      iVar9 = (int)sVar15 + 1;
      while (iVar9 != 0) {
        lVar20 = (long)iVar9;
        iVar9 = iVar9 + -1;
        *(undefined1 *)((long)&local_438 + lVar20) = *(undefined1 *)((long)&local_438 + (long)iVar9)
        ;
      }
      local_438 = 0x2a25;
      local_458 = 0;
      sscanf_s(lpMultiByteStr,(char *)&local_438,&local_458);
      if ((ulong)local_458 == 0) {
        PAL_free(lpMultiByteStr);
        iVar9 = local_454;
        goto LAB_00119b03;
      }
      uVar10 = ap->gp_offset;
      if ((ulong)uVar10 < 0x29) {
        plVar16 = (long *)((ulong)uVar10 + (long)ap->reg_save_area);
        ap->gp_offset = uVar10 + 8;
      }
      else {
        plVar16 = (long *)ap->overflow_arg_area;
        ap->overflow_arg_area = plVar16 + 1;
      }
      lVar20 = *plVar16;
      if (0 < (int)local_458) {
        uVar26 = 0;
        do {
          *(WCHAR *)(lVar20 + uVar26 * 2) = pWVar27[uVar26];
          uVar26 = uVar26 + 1;
        } while (local_458 != uVar26);
      }
      *(undefined2 *)(lVar20 + (long)(int)local_458 * 2) = 0;
      PAL_free(lpMultiByteStr);
      iVar8 = 1;
    }
    pWVar24 = pWVar27 + (int)local_458;
    iVar9 = local_454 + iVar8;
    goto LAB_00119404;
  }
  if ((char)local_44c == '\0') {
    if ((char)local_444 == '\0') goto LAB_00119546;
LAB_00119522:
    uVar10 = ap->gp_offset;
    if ((ulong)uVar10 < 0x29) {
      puVar14 = (undefined8 *)((ulong)uVar10 + (long)ap->reg_save_area);
      ap->gp_offset = uVar10 + 8;
    }
    else {
      puVar14 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar14 + 1;
    }
    *(int *)*puVar14 = (int)((ulong)((long)pWVar27 - (long)Buffer) >> 1);
LAB_001197db:
    iVar19 = 4;
    pWVar24 = pWVar27;
    goto LAB_00119404;
  }
  bVar6 = iVar8 == -1 & bVar6;
  if (bVar6 != 0) {
    iVar8 = 1;
  }
  uVar26 = (ulong)bVar6;
  uVar10 = (uint)bVar6;
  if (pWVar27[uVar26] == L'\0') {
LAB_001195d8:
    uVar10 = (uint)bVar6;
  }
  else {
    iVar9 = isspace((uint)(ushort)pWVar27[uVar26]);
    if ((iVar9 != 0) || (iVar8 != -1 && iVar8 <= (int)(uint)bVar6)) goto LAB_001195d8;
    while( true ) {
      uVar10 = uVar10 + 1;
      uVar26 = (ulong)(int)uVar10;
      if (pWVar27[uVar26] == L'\0') break;
      iVar9 = isspace((uint)(ushort)pWVar27[uVar26]);
      if ((iVar9 != 0) || (iVar8 != -1 && iVar8 <= (int)uVar10)) break;
    }
  }
  pWVar24 = pWVar27 + uVar26;
  iVar9 = local_454;
  iVar19 = local_43c;
  if (cVar7 != L'*') {
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar16 = (long *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      plVar16 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar16 + 1;
    }
    lVar20 = *plVar16;
    if (0 < (int)uVar10) {
      uVar21 = 0;
      do {
        *(WCHAR *)(lVar20 + uVar21 * 2) = pWVar27[uVar21];
        uVar21 = uVar21 + 1;
      } while (uVar10 != uVar21);
    }
    if ((char)local_440 != '\0') {
      *(undefined2 *)(lVar20 + uVar26 * 2) = 0;
    }
    iVar9 = local_454 + 1;
  }
LAB_00119404:
  cVar7 = *Format;
  pWVar27 = pWVar24;
  if (cVar7 == L'\0') goto LAB_00119b03;
  goto LAB_00118f50;
}

Assistant:

__attribute__((no_instrument_function))
int PAL_wvsscanf(LPCWSTR Buffer, LPCWSTR Format, va_list ap)
{
    INT Length = 0;
    LPCWSTR Buff = Buffer;
    LPCWSTR Fmt = Format;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    BOOL Store;
    INT Width;
    INT Prefix;
    INT Type = -1;

    while (*Fmt)
    {
        if (!*Buff && Length == 0)
        {
            Length = EOF;
            break;
        }
        /* remove any number of blanks */
        else if (isspace(*Fmt))
        {
            while (isspace(*Buff))
            {
                ++Buff;
            }
            ++Fmt;
        }
        else if (*Fmt == '%' &&
                 Internal_ScanfExtractFormatW(&Fmt, TempBuff, sizeof(TempBuff), &Store,
                                              &Width, &Prefix, &Type))
        {
            if (Prefix == SCANF_PREFIX_LONG &&
                (Type == SCANF_TYPE_STRING || Type == SCANF_TYPE_CHAR))
            {
                int len = 0;
                WCHAR *charPtr = 0;

                /* a single character */
                if (Type == SCANF_TYPE_CHAR && Width == -1)
                {
                    len = Width = 1;
                }

                /* calculate length of string to copy */
                while (Buff[len] && !isspace(Buff[len]))
                {
                    if (Width != -1 && len >= Width)
                    {
                        break;
                    }
                    ++len;
                }

                if (Store)
                {
                    int i;
                    charPtr = va_arg(ap, WCHAR *);

                    for (i = 0; i < len; i++)
                    {
                        charPtr[i] = Buff[i];
                    }
                    if (Type == SCANF_TYPE_STRING)
                    {
                        /* end string */
                        charPtr[len] = 0;
                    }
                    ++Length;
                }
                Buff += len;
            }
            /* this places the number of bytes stored into the next arg */
            else if (Type == SCANF_TYPE_N)
            {
                if (Prefix == SCANF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = Buff - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = Buff - Buffer;
                }
            }
            /* types that sscanf can handle */
            else
            {
                int ret;
                int n;
                int size;
                LPSTR newBuff = 0;
                LPVOID voidPtr = NULL;

                size = WideCharToMultiByte(CP_ACP, 0, Buff, -1, 0, 0, 0, 0);
                if (!size)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                        GetLastError());
                    return -1;
                }
                newBuff = (LPSTR) PAL_malloc(size);
                if (!newBuff)
                {
                    ERROR("PAL_malloc failed\n");
                    SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    return -1;
                }
                size = WideCharToMultiByte(CP_ACP, 0, Buff, size,
                                           newBuff, size, 0, 0);
                if (!size)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                        GetLastError());
                    PAL_free(newBuff);
                    return -1;
                }

                if (Store)
                {
                    if (Type == SCANF_TYPE_BRACKETS)
                    {
                        WCHAR *strPtr;
                        int i;

                        /* add a '*' to %[] --> %*[]  */
                        i = strlen(TempBuff) + 1;
                        while (i)
                        {
                            /* shift everything right one */
                            TempBuff[i] = TempBuff[i - 1];
                            --i;
                        }
                        TempBuff[0] = '%';
                        TempBuff[1] = '*';

                        /* %n doesn't count as a conversion. Since we're
                           suppressing conversion of the %[], sscanf will
                           always return 0, so we can't use the return value
                           to determine success. Set n to 0 before the call; if
                           it's still 0 afterwards, we know the call failed */
                        n = 0;
                        sscanf_s(newBuff, TempBuff, &n);
                        if(0 == n)
                        {
                            /* sscanf failed, nothing matched. set ret to 0,
                               so we know we have to break */
                            ret = 0;
                        }
                        else
                        {
                            strPtr = va_arg(ap, WCHAR *);
                            for (i = 0; i < n; i++)
                            {
                                strPtr[i] = Buff[i];
                            }
                            strPtr[n] = 0; /* end string */
                            ret = 1;
                        }
                    }
                    else
                    {
                        voidPtr = va_arg(ap, LPVOID);
                        // sscanf_s requires that if we are trying to read "%s" or "%c", then
                        // the size of the buffer must follow the buffer we are trying to read into.
                        unsigned typeLen = 0;
                        if (Type == SCANF_TYPE_STRING)
                        {
                            // We don't really know the size of the destination buffer provided by the
                            // caller. So we have to assume that the caller has allocated enough space
                            // to hold either the width specified in the format or the entire input
                            // string plus '\0'.
                            typeLen = ((Width > 0) ? Width : PAL_wcslen(Buffer)) + 1;
                        }
                        else if (Type == SCANF_TYPE_CHAR)
                        {
                            // Check whether the format string contains number of characters
                            // that should be read from the input string.
                            // Note: '\0' does not get appended in the "%c" case.
                            typeLen = (Width > 0) ? Width : 1;
                        }

                        if (typeLen > 0)
                        {
                            ret = sscanf_s(newBuff, TempBuff, voidPtr, typeLen, &n);
                        }
                        else
                            ret = sscanf_s(newBuff, TempBuff, voidPtr, &n);
                    }
                }
                else
                {
                    ret = sscanf_s(newBuff, TempBuff, &n);
                }

#if SSCANF_CANNOT_HANDLE_MISSING_EXPONENT
                if ((ret == 0) && (Type == SCANF_TYPE_FLOAT))
                {
                    ret = SscanfFloatCheckExponent(newBuff, TempBuff, voidPtr, &n);
                }
#endif // SSCANF_CANNOT_HANDLE_MISSING_EXPONENT

                PAL_free(newBuff);
                if (ret > 0)
                {
                    Length += ret;
                }
                else
                {
                    /* no match; break scan */
                    break;
                }
                Buff += n;
            }
       }
        else
        {
            /* grab, but not store */
            if (*Fmt == *Buff && Type != SCANF_TYPE_SPACE)
            {
                ++Fmt;
                ++Buff;
            }
            /* doesn't match, break scan */
            else
            {
                break;
            }
        }
    }

    return Length;
}